

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O1

void __thiscall
t_swift_generator::render_const_value
          (t_swift_generator *this,ostream *out,t_type *type,t_const_value *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  pointer pcVar3;
  t_field *tfield;
  long lVar4;
  size_t __n;
  undefined1 *puVar5;
  t_type *type_00;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  *pmVar6;
  string *psVar7;
  int iVar8;
  t_const_value_type tVar9;
  t_type *ptVar10;
  ostream *poVar11;
  _Rb_tree_node_base *p_Var12;
  ostream *poVar13;
  int64_t iVar14;
  _Base_ptr p_Var15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  undefined4 extraout_var;
  long *plVar17;
  undefined4 extraout_var_00;
  size_type *psVar18;
  ulong uVar19;
  t_swift_generator *this_00;
  char *pcVar20;
  _func_int **pp_Var21;
  _Rb_tree_header *p_Var22;
  t_const_value *value_00;
  bool bVar23;
  undefined1 auVar24 [12];
  string local_d0;
  t_type *local_b0;
  ostream *local_a8;
  t_const_value *local_a0;
  _func_int **local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ptVar10 = t_type::get_true_type(type);
  iVar8 = (*(ptVar10->super_t_doc)._vptr_t_doc[5])(ptVar10);
  local_b0 = ptVar10;
  if ((char)iVar8 == '\0') {
    iVar8 = (*(ptVar10->super_t_doc)._vptr_t_doc[10])(ptVar10);
    local_a8 = out;
    if ((char)iVar8 == '\0') {
      iVar8 = (*(ptVar10->super_t_doc)._vptr_t_doc[0xb])(ptVar10);
      if (((char)iVar8 != '\0') ||
         (iVar8 = (*(ptVar10->super_t_doc)._vptr_t_doc[0xc])(ptVar10), (char)iVar8 != '\0')) {
        type_name_abi_cxx11_(&local_d0,this,ptVar10,false,false);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (out,local_d0._M_dataplus._M_p,local_d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"(",1);
        paVar1 = &local_d0.field_2;
        local_a0 = value;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != paVar1) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        pp_Var21 = ptVar10[1].super_t_doc._vptr_t_doc;
        out = local_a8;
        if (pp_Var21 != (_func_int **)ptVar10[1].super_t_doc.doc_._M_dataplus._M_p) {
          pmVar6 = &local_a0->mapVal_;
          do {
            tfield = (t_field *)*pp_Var21;
            value_00 = (t_const_value *)0x0;
            p_Var12 = (local_a0->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            local_98 = pp_Var21;
            poVar11 = local_a8;
            while (local_a8 = poVar11,
                  (_Rb_tree_header *)p_Var12 != &(pmVar6->_M_t)._M_impl.super__Rb_tree_header) {
              lVar4 = *(long *)(*(long *)(p_Var12 + 1) + 0x48);
              local_d0._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_d0,lVar4,*(long *)(*(long *)(p_Var12 + 1) + 0x50) + lVar4)
              ;
              __n = (tfield->name_)._M_string_length;
              if (__n == local_d0._M_string_length) {
                if (__n == 0) {
                  bVar23 = true;
                }
                else {
                  iVar8 = bcmp((tfield->name_)._M_dataplus._M_p,local_d0._M_dataplus._M_p,__n);
                  bVar23 = iVar8 == 0;
                }
              }
              else {
                bVar23 = false;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != paVar1) {
                operator_delete(local_d0._M_dataplus._M_p);
              }
              if (bVar23) {
                value_00 = (t_const_value *)p_Var12[1]._M_parent;
              }
              p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
              poVar11 = local_a8;
            }
            if (value_00 == (t_const_value *)0x0) {
              bVar23 = field_is_optional(this,tfield);
              if (!bVar23) {
                pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          __cxa_allocate_exception(0x20);
                iVar8 = (*(local_b0->super_t_doc)._vptr_t_doc[3])();
                std::operator+(&local_50,"constant error: required field ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(extraout_var,iVar8));
                plVar17 = (long *)std::__cxx11::string::append((char *)&local_50);
                local_90._M_dataplus._M_p = (pointer)*plVar17;
                psVar18 = (size_type *)(plVar17 + 2);
                if ((size_type *)local_90._M_dataplus._M_p == psVar18) {
                  local_90.field_2._M_allocated_capacity = *psVar18;
                  local_90.field_2._8_8_ = plVar17[3];
                  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
                }
                else {
                  local_90.field_2._M_allocated_capacity = *psVar18;
                }
                local_90._M_string_length = plVar17[1];
                *plVar17 = (long)psVar18;
                plVar17[1] = 0;
                *(undefined1 *)(plVar17 + 2) = 0;
                std::operator+(&local_d0,&local_90,&tfield->name_);
                std::operator+(pbVar16,&local_d0," has no value");
                __cxa_throw(pbVar16,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
              }
            }
            else {
              poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(tfield->name_)._M_dataplus._M_p,
                                   (tfield->name_)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,": ",2);
              render_const_value(this,poVar11,tfield->type_,value_00);
            }
            ptVar10 = local_b0;
            pp_Var21 = local_98 + 1;
            if (pp_Var21 != (_func_int **)local_b0[1].super_t_doc.doc_._M_dataplus._M_p) {
              std::__ostream_insert<char,std::char_traits<char>>(local_a8,", ",2);
            }
            out = local_a8;
          } while (pp_Var21 != (_func_int **)ptVar10[1].super_t_doc.doc_._M_dataplus._M_p);
        }
        goto LAB_003552c5;
      }
      iVar8 = (*(ptVar10->super_t_doc)._vptr_t_doc[0x10])(ptVar10);
      if ((char)iVar8 == '\0') {
        iVar8 = (*(ptVar10->super_t_doc)._vptr_t_doc[0xe])(ptVar10);
        if ((char)iVar8 == '\0') {
          iVar8 = (*(ptVar10->super_t_doc)._vptr_t_doc[0xf])(ptVar10);
          if ((char)iVar8 == '\0') {
            pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __cxa_allocate_exception(0x20);
            iVar8 = (*(ptVar10->super_t_doc)._vptr_t_doc[3])(ptVar10);
            std::operator+(pbVar16,"compiler error: no const of type ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var_00,iVar8));
            __cxa_throw(pbVar16,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
          p_Var15 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var22 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)p_Var15 != p_Var22) {
            ptVar10 = *(t_type **)&ptVar10[1].super_t_doc.has_doc_;
            while( true ) {
              render_const_value(this,out,ptVar10,*(t_const_value **)(p_Var15 + 1));
              p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
              if ((_Rb_tree_header *)p_Var15 == p_Var22) break;
              std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
            }
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
          p_Var15 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var22 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)p_Var15 != p_Var22) {
            ptVar10 = *(t_type **)&ptVar10[1].super_t_doc.has_doc_;
            while( true ) {
              render_const_value(this,out,ptVar10,*(t_const_value **)(p_Var15 + 1));
              p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
              if ((_Rb_tree_header *)p_Var15 == p_Var22) break;
              std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
            }
          }
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
        p_Var15 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var22 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var15 != p_Var22) {
          type_00 = *(t_type **)&ptVar10[1].super_t_doc.has_doc_;
          ptVar10 = *(t_type **)&ptVar10[1].annotations_._M_t._M_impl;
          while( true ) {
            render_const_value(this,out,type_00,*(t_const_value **)(p_Var15 + 1));
            std::__ostream_insert<char,std::char_traits<char>>(out,": ",2);
            render_const_value(this,out,ptVar10,(t_const_value *)p_Var15[1]._M_parent);
            p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
            if ((_Rb_tree_header *)p_Var15 == p_Var22) break;
            std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
          }
        }
      }
      pcVar20 = "]";
      uVar19 = 1;
      goto LAB_00355360;
    }
    bVar23 = this->gen_cocoa_;
    if (bVar23 == true) {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      pcVar3 = (value->identifierVal_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar3,pcVar3 + (value->identifierVal_)._M_string_length);
    }
    else {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      this_00 = (t_swift_generator *)(value->identifierVal_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,this_00,
                 (pointer)((long)&(this_00->super_t_oop_generator).super_t_generator.
                                  _vptr_t_generator + (value->identifierVal_)._M_string_length));
      enum_const_name(&local_d0,this_00,&local_70);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (local_a8,local_d0._M_dataplus._M_p,local_d0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if (bVar23 != false) {
      return;
    }
    psVar7 = &local_70;
  }
  else {
    uVar2 = *(uint *)&ptVar10[1].super_t_doc._vptr_t_doc;
    switch(uVar2) {
    case 1:
      std::__ostream_insert<char,std::char_traits<char>>(out,"\"",1);
      t_generator::get_escaped_string_abi_cxx11_(&local_d0,(t_generator *)this,value);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (out,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"",1);
      break;
    case 2:
      iVar14 = t_const_value::get_integer(value);
      pcVar20 = "false";
      if (0 < iVar14) {
        pcVar20 = "true";
      }
      uVar19 = (ulong)(0 < iVar14) ^ 5;
LAB_00355360:
      std::__ostream_insert<char,std::char_traits<char>>(out,pcVar20,uVar19);
      return;
    case 3:
    case 4:
    case 5:
    case 6:
      type_name_abi_cxx11_(&local_d0,this,ptVar10,false,false);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (out,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"(",1);
      t_const_value::get_integer(value);
      poVar11 = std::ostream::_M_insert<long>((long)poVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,")",1);
      break;
    case 7:
      type_name_abi_cxx11_(&local_d0,this,ptVar10,false,false);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (out,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"(",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      tVar9 = t_const_value::get_type(value);
      if (tVar9 == CV_INTEGER) {
        t_const_value::get_integer(value);
        std::ostream::_M_insert<long>((long)out);
      }
      else {
        std::ostream::_M_insert<double>(value->doubleVal_);
      }
LAB_003552c5:
      std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
      return;
    default:
      auVar24 = __cxa_allocate_exception(0x20);
      t_base_type::t_base_name_abi_cxx11_(&local_d0,(t_base_type *)(ulong)uVar2,auVar24._8_4_);
      std::operator+(auVar24._0_8_,"compiler error: no const of base type ",&local_d0);
      __cxa_throw(auVar24._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    psVar7 = &local_d0;
  }
  puVar5 = *(undefined1 **)((psVar7->field_2)._M_local_buf + -0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar5 != &psVar7->field_2) {
    operator_delete(puVar5);
  }
  return;
}

Assistant:

void t_swift_generator::render_const_value(ostream& out,
                                           t_type* type,
                                           t_const_value* value) {
  type = get_true_type(type);

  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_STRING:
      out << "\"" << get_escaped_string(value) << "\"";
      break;
    case t_base_type::TYPE_BOOL:
      out << ((value->get_integer() > 0) ? "true" : "false");
      break;
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
    case t_base_type::TYPE_I64:
      out << type_name(type) << "(" << value->get_integer() << ")";
      break;
    case t_base_type::TYPE_DOUBLE:
      out << type_name(type) << "(";
      if (value->get_type() == t_const_value::CV_INTEGER) {
        out << value->get_integer();
      } else {
        out << value->get_double();
      }
      out << ")";
      break;
    default:
      throw "compiler error: no const of base type " + t_base_type::t_base_name(tbase);
    }
  } else if (type->is_enum()) {
    out << (gen_cocoa_ ? value->get_identifier() : enum_const_name(value->get_identifier())); // Swift2/Cocoa compatibility
  } else if (type->is_struct() || type->is_xception()) {

    out << type_name(type) << "(";

    const vector<t_field*>& fields = ((t_struct*)type)->get_members();
    vector<t_field*>::const_iterator f_iter;

    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;

    for (f_iter = fields.begin(); f_iter != fields.end();) {
      t_field* tfield = *f_iter;
      t_const_value* value = nullptr;
      for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
        if (tfield->get_name() == v_iter->first->get_string()) {
          value = v_iter->second;
        }
      }

      if (value) {
        out << tfield->get_name() << ": ";
        render_const_value(out, tfield->get_type(), value);
      }
      else if (!field_is_optional(tfield)) {
        throw "constant error: required field " + type->get_name() + "." + tfield->get_name() + " has no value";
      }

      if (++f_iter != fields.end()) {
        out << ", ";
      }
    }

    out << ")";

  } else if (type->is_map()) {

    out << "[";

    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();

    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;

    for (v_iter = val.begin(); v_iter != val.end();) {

      render_const_value(out, ktype, v_iter->first);
      out << ": ";
      render_const_value(out, vtype, v_iter->second);

      if (++v_iter != val.end()) {
        out << ", ";
      }
    }

    out << "]";

  } else if (type->is_list()) {

    out << "[";

    t_type* etype = ((t_list*)type)->get_elem_type();

    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;

    for (v_iter = val.begin(); v_iter != val.end();) {

      render_const_value(out, etype, v_iter->first);

      if (++v_iter != val.end()) {
        out << ", ";
      }
    }

    out << "]";

  } else if (type->is_set()) {

    out << "[";

    t_type* etype = ((t_set*)type)->get_elem_type();

    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;

    for (v_iter = val.begin(); v_iter != val.end();) {

      render_const_value(out, etype, v_iter->first);

      if (++v_iter != val.end()) {
        out << ", ";
      }
    }

    out << "]";

  } else {
    throw "compiler error: no const of type " + type->get_name();
  }

}